

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O0

void __thiscall RCO::dump(RCO *this,string *outputDirectory)

{
  FILE *f_00;
  char *__filename;
  string local_110 [32];
  FILE *local_f0;
  FILE *f;
  string outputFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  string *local_18;
  string *outputDirectory_local;
  RCO *this_local;
  
  local_18 = outputDirectory;
  outputDirectory_local = (string *)this;
  std::operator+(local_38,(char *)outputDirectory);
  createDirectory(local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::operator+(local_68,(char *)outputDirectory);
  createDirectory(local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::operator+(local_88,(char *)outputDirectory);
  createDirectory(local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::operator+(local_a8,(char *)outputDirectory);
  createDirectory(local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::operator+(local_c8,(char *)outputDirectory);
  createDirectory(local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 (char *)outputDirectory);
  __filename = (char *)std::__cxx11::string::c_str();
  local_f0 = fopen(__filename,"wb");
  fprintf(local_f0,"<?xml version=\"1.0\" encoding=\"utf-8\"?>\r\n");
  f_00 = local_f0;
  std::__cxx11::string::string(local_110,(string *)outputDirectory);
  dumpElement(this,(FILE *)f_00,&this->mRootElement,0,(string *)local_110);
  std::__cxx11::string::~string(local_110);
  fclose(local_f0);
  std::__cxx11::string::~string((string *)&f);
  return;
}

Assistant:

void RCO::dump(std::string outputDirectory)
{
	createDirectory(outputDirectory + "/");
	createDirectory(outputDirectory + "/xmls/");
	createDirectory(outputDirectory + "/textures/");
	createDirectory(outputDirectory + "/sounds/");
	createDirectory(outputDirectory + "/layouts/");

	std::string outputFile = outputDirectory + "/index.xml";

	FILE *f = fopen(outputFile.c_str(), "wb");

	fprintf(f, "<?xml version=\"1.0\" encoding=\"utf-8\"?>\r\n");
	dumpElement(f, mRootElement, 0, outputDirectory);

	fclose(f);
}